

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O3

void __thiscall
iu_StringSplitLvalue_x_iutest_x_chain_at_first_by_stl_str_Test<wchar_t>::Body
          (iu_StringSplitLvalue_x_iutest_x_chain_at_first_by_stl_str_Test<wchar_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar4;
  AssertionResult iutest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> s;
  array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
  re;
  AssertionResult local_2c0;
  AssertionHelper local_298;
  undefined1 local_268 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  unsigned_long local_240;
  uint local_234;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_230;
  long *local_210 [2];
  long local_200 [2];
  undefined1 local_1f0 [32];
  bool local_1d0;
  ios_base local_170 [264];
  array<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_2UL>
  local_68;
  
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_230,L"arikitari na_world!",L"");
  local_210[0] = local_200;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_210,L"_ ",L"");
  std::__cxx11::wstring::wstring((wstring *)&local_298,(wstring *)local_210);
  detail::
  split_helper<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
  ::operator>><detail::split_at_first,_nullptr>
            ((split_helper_subroutine<detail::split_at_first,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
              *)local_1f0,
             (split_helper<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
              *)&local_298);
  detail::
  operator|<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t,_nullptr>
            (&local_68,&local_230,
             (split_helper_subroutine<detail::split_at_first,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
              *)local_1f0);
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ * 4 + 4);
  }
  paVar1 = &local_298.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_298.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity * 4 + 4);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] * 4 + 4);
  }
  local_234 = 2;
  iutest::detail::ExpressionLHS<unsigned_int>::ExpressionLHS
            ((ExpressionLHS<unsigned_int> *)local_268,&local_234);
  local_240 = 2;
  iutest::detail::ExpressionLHS<unsigned_int>::operator==
            ((ExpressionResult *)&local_298,(ExpressionLHS<unsigned_int> *)local_268,&local_240);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1f0,(ExpressionResult *)&local_298,true);
  paVar2 = &local_2c0.m_message.field_2;
  local_2c0.m_message._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_1f0._0_8_,local_1f0._8_8_ + local_1f0._0_8_);
  local_2c0.m_result = local_1d0;
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_298.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._8_8_ != &local_250) {
    operator_delete((void *)local_268._8_8_,local_250._M_allocated_capacity + 1);
  }
  if (local_2c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1f0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_2c0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((2u == re.size()))",
               "false","true",(char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,(char *)local_268._0_8_,(allocator<char> *)&local_240);
    local_298.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_298.m_part_result.super_iuCodeMessage.m_line = 0x88;
    local_298.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_298,(Fixed *)local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_298.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) goto LAB_00169430;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_2c0.m_message._M_dataplus._M_p,
                      local_2c0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1f0._0_8_ = L"arikitari";
    iutest::internal::CmpHelperEQ<wchar_t_const*,std::__cxx11::wstring>
              (&local_2c0,(internal *)"constant::arikitari<char_type>()","re[0]",local_1f0,
               (wchar_t **)&local_68,in_R9);
    if (local_2c0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1f0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,local_2c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)local_268);
      local_298.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
      ;
      local_298.m_part_result.super_iuCodeMessage.m_line = 0x89;
      local_298.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_298,(Fixed *)local_1f0);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0.m_message._M_dataplus._M_p != paVar2) {
        operator_delete(local_2c0.m_message._M_dataplus._M_p,
                        local_2c0.m_message.field_2._M_allocated_capacity + 1);
      }
      local_1f0._0_8_ = L"na_world!";
      iutest::internal::CmpHelperEQ<wchar_t_const*,std::__cxx11::wstring>
                (&local_2c0,(internal *)"constant::na_world<char_type>()","re[1]",local_1f0,
                 (wchar_t **)(local_68._M_elems + 1),in_R9);
      if (local_2c0.m_result != false) goto LAB_00169459;
      memset((iu_global_format_stringstream *)local_1f0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,local_2c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)local_268);
      local_298.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
      ;
      local_298.m_part_result.super_iuCodeMessage.m_line = 0x8a;
      local_298.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_298,(Fixed *)local_1f0);
    }
    local_268._16_8_ =
         local_298.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    local_268._0_8_ = local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
LAB_00169430:
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
  std::ios_base::~ios_base(local_170);
LAB_00169459:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_2c0.m_message._M_dataplus._M_p,
                    local_2c0.m_message.field_2._M_allocated_capacity + 1);
  }
  lVar3 = -0x40;
  paVar4 = &local_68._M_elems[1].field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],
                      paVar4->_M_allocated_capacity * 4 + 4);
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
              *)(&paVar4->_M_allocated_capacity + -4);
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}